

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

void av1_cdef_search(AV1_COMP *cpi)

{
  CDEF_PICK_METHOD pick_method_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  CDEF_PICK_METHOD pick_method_01;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  int iVar10;
  long *in_RDI;
  int new_sec_chroma_strength;
  int new_pri_chroma_strength;
  int new_sec_luma_strength;
  int new_pri_luma_strength;
  int chroma_strength_1;
  int luma_strength_1;
  int j_1;
  int sec_strength;
  int pri_strength;
  int chroma_strength;
  int luma_strength;
  int j;
  uint64_t curr;
  int gi;
  int best_gi;
  uint64_t best_mse;
  int i_1;
  uint64_t rd;
  uint64_t dist;
  int rate_cost;
  int total_bits;
  uint64_t tot_mse;
  int nb_strengths;
  int best_lev1 [16];
  int best_lev0 [16];
  int i;
  int rdmult;
  int max_signaling_bits;
  int joint_strengths;
  int total_strengths;
  uint64_t (*mse [2]) [64];
  int sb_count;
  CdefInfo *cdef_info;
  uint64_t best_rd;
  int nb_strength_bits;
  CdefSearchCtx *cdef_search_ctx;
  MACROBLOCKD *xd;
  int num_planes;
  int fast;
  int damping;
  CommonModeInfoParams *mi_params;
  int use_screen_content_model;
  CDEF_PICK_METHOD pick_method;
  int rtc_ext_rc;
  CdefInfo *cdef_info_1;
  CDEF_CONTROL cdef_control;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int iVar11;
  undefined4 in_stack_fffffffffffffe50;
  undefined2 in_stack_fffffffffffffe54;
  bool bVar12;
  undefined1 uVar13;
  undefined1 in_stack_fffffffffffffe57;
  CDEF_PICK_METHOD in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  CDEF_PICK_METHOD in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  int iVar14;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int iVar15;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  AV1_COMMON *in_stack_fffffffffffffe90;
  int local_168;
  int local_164;
  ulong local_160;
  int local_154;
  uint64_t local_138;
  undefined1 local_128 [56];
  undefined1 local_e8 [4];
  int local_9c;
  ulong local_68;
  int local_5c;
  
  iVar14 = *(int *)((long)in_RDI + 0x4243c);
  if (((iVar14 == 2) && (*(int *)(*in_RDI + 0x14dc4) != 0)) ||
     (((iVar14 == 3 && ((char)in_RDI[0x84ee] == '\x02')) &&
      (((*(int *)((long)in_RDI + 0x423dc) == 3 || (*(int *)((long)in_RDI + 0x423dc) == 2)) &&
       ((int)in_RDI[0x847b] < 0x21)))))) {
    *(undefined4 *)((long)in_RDI + 0x41bb4) = 1;
    *(undefined4 *)(in_RDI + 0x8387) = 0;
    *(undefined4 *)(in_RDI + 0x8377) = 0;
    *(undefined4 *)(in_RDI + 0x837f) = 0;
  }
  else if ((int)in_RDI[0xc10e] == 0) {
    pick_method_00 = *(CDEF_PICK_METHOD *)((long)in_RDI + 0x60c64);
    if (pick_method_00 == CDEF_PICK_FROM_Q) {
      av1_pick_cdef_from_qp
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
    }
    else {
      lVar4 = in_RDI[0x783d];
      bVar12 = pick_method_00 != CDEF_FULL_SEARCH && pick_method_00 < CDEF_PICK_FROM_Q;
      uVar13 = bVar12;
      iVar6 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x77f0));
      if (in_RDI[0x8585] == 0) {
        pvVar8 = aom_malloc(0x2a4c01);
        in_RDI[0x8585] = (long)pvVar8;
        if (in_RDI[0x8585] == 0) {
          aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cpi->cdef_search_ctx");
        }
      }
      lVar1 = in_RDI[0x8585];
      cdef_params_init((YV12_BUFFER_CONFIG *)in_stack_fffffffffffffe90,
                       (YV12_BUFFER_CONFIG *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       (CdefSearchCtx *)
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       in_stack_fffffffffffffe6c);
      cdef_alloc_data((AV1_COMMON *)
                      CONCAT17(in_stack_fffffffffffffe57,
                               CONCAT16(uVar13,CONCAT24(in_stack_fffffffffffffe54,
                                                        in_stack_fffffffffffffe50))),
                      (CdefSearchCtx *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                     );
      if ((int)in_RDI[0x135c9] < 2) {
        cdef_mse_calc_frame((CdefSearchCtx *)
                            CONCAT17(in_stack_fffffffffffffe57,
                                     CONCAT16(uVar13,CONCAT24(in_stack_fffffffffffffe54,
                                                              in_stack_fffffffffffffe50))),
                            (aom_internal_error_info *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      }
      else {
        av1_cdef_mse_calc_frame_mt
                  ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      }
      local_5c = 0;
      local_68 = 0xffffffffffffffff;
      iVar15 = *(int *)(lVar1 + 0x1f20);
      lVar2 = *(long *)(lVar1 + 0x1f08);
      lVar3 = *(long *)(lVar1 + 0x1f10);
      pick_method_01 = nb_cdef_strengths[pick_method_00];
      if (1 < iVar6) {
        pick_method_01 = pick_method_01 * pick_method_01;
      }
      if (pick_method_01 == CDEF_FAST_SEARCH_LVL1) {
        iVar11 = 0;
      }
      else {
        iVar11 = get_msb(pick_method_01 - CDEF_FAST_SEARCH_LVL1);
        iVar11 = iVar11 + 1;
      }
      lVar5 = in_RDI[0x3249];
      for (local_9c = 0; (local_9c < 4 && (local_9c <= iVar11)); local_9c = local_9c + 1) {
        memset(local_e8,0,0x40);
        memset(local_128,0,0x40);
        iVar7 = 1 << ((byte)local_9c & 0x1f);
        if (iVar6 < 2) {
          local_138 = joint_strength_search
                                ((int *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),in_stack_fffffffffffffe6c,
                                 (uint64_t (*) [64])
                                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                 in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
        }
        else {
          local_138 = joint_strength_search_dual
                                ((int *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),
                                 (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ),in_stack_fffffffffffffe64,
                                 (uint64_t (**) [64])
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                 CONCAT13(in_stack_fffffffffffffe57,
                                          CONCAT12(uVar13,in_stack_fffffffffffffe54)),pick_method_01
                                );
        }
        iVar10 = 1;
        if (1 < iVar6) {
          iVar10 = 2;
        }
        uVar9 = ((long)((iVar15 * local_9c + iVar7 * 6 * iVar10) * 0x200) * (long)(int)lVar5 + 0x100
                >> 9) + local_138 * 0x800;
        if (uVar9 < local_68) {
          local_5c = local_9c;
          memcpy(in_RDI + 0x8377,local_e8,(long)iVar7 << 2);
          local_68 = uVar9;
          if (1 < iVar6) {
            memcpy(in_RDI + 0x837f,local_128,(long)iVar7 << 2);
          }
        }
      }
      *(int *)(in_RDI + 0x8387) = local_5c;
      *(int *)((long)in_RDI + 0x41bb4) = 1 << ((byte)local_5c & 0x1f);
      for (local_154 = 0; local_154 < iVar15; local_154 = local_154 + 1) {
        local_160 = 0xffffffffffffffff;
        local_164 = 0;
        for (local_168 = 0; local_168 < *(int *)((long)in_RDI + 0x41bb4); local_168 = local_168 + 1)
        {
          uVar9 = *(ulong *)(lVar2 + (long)local_154 * 0x200 +
                            (long)*(int *)((long)in_RDI + (long)local_168 * 4 + 0x41bb8) * 8);
          if (1 < iVar6) {
            uVar9 = *(long *)(lVar3 + (long)local_154 * 0x200 +
                             (long)*(int *)((long)in_RDI + (long)local_168 * 4 + 0x41bf8) * 8) +
                    uVar9;
          }
          if (uVar9 < local_160) {
            local_164 = local_168;
            local_160 = uVar9;
          }
        }
        lVar5 = *(long *)(in_RDI[0x7837] +
                         (long)*(int *)(*(long *)(lVar1 + 0x1f18) + (long)local_154 * 4) * 8);
        *(ushort *)(lVar5 + 0xa7) =
             *(ushort *)(lVar5 + 0xa7) & 0x87ff | ((byte)local_164 & 0xf) << 0xb;
      }
      if (bVar12) {
        for (iVar6 = 0; iVar6 < *(int *)((long)in_RDI + 0x41bb4); iVar6 = iVar6 + 1) {
          iVar15 = *(int *)((long)in_RDI + (long)iVar6 * 4 + 0x41bf8);
          get_cdef_filter_strengths
                    (pick_method_00,(int *)&stack0xfffffffffffffe80,(int *)&stack0xfffffffffffffe7c,
                     *(int *)((long)in_RDI + (long)iVar6 * 4 + 0x41bb8));
          *(int *)((long)in_RDI + (long)iVar6 * 4 + 0x41bb8) =
               in_stack_fffffffffffffe80 * 4 + in_stack_fffffffffffffe7c;
          get_cdef_filter_strengths
                    (pick_method_00,(int *)&stack0xfffffffffffffe80,(int *)&stack0xfffffffffffffe7c,
                     iVar15);
          *(int *)((long)in_RDI + (long)iVar6 * 4 + 0x41bf8) =
               in_stack_fffffffffffffe80 * 4 + in_stack_fffffffffffffe7c;
        }
      }
      if ((((iVar14 == 3) && ((char)in_RDI[0x84ee] == '\x02')) &&
          ((*(int *)((long)in_RDI + 0x423dc) == 3 || (*(int *)((long)in_RDI + 0x423dc) == 2)))) &&
         ((int)in_RDI[0x847b] < 0xdd)) {
        for (iVar14 = 0; iVar14 < *(int *)((long)in_RDI + 0x41bb4); iVar14 = iVar14 + 1) {
          iVar6 = *(int *)((long)in_RDI + (long)iVar14 * 4 + 0x41bb8);
          iVar15 = *(int *)((long)in_RDI + (long)iVar14 * 4 + 0x41bf8);
          *(int *)((long)in_RDI + (long)iVar14 * 4 + 0x41bb8) =
               (iVar6 / 4 >> 1) * 4 + (iVar6 % 4 >> 1);
          *(int *)((long)in_RDI + (long)iVar14 * 4 + 0x41bf8) =
               (iVar15 / 4 >> 1) * 4 + (iVar15 % 4 >> 1);
        }
      }
      *(int *)(in_RDI + 0x8376) = ((int)lVar4 >> 6) + 3;
      av1_cdef_dealloc_data((CdefSearchCtx *)0x2a53b6);
    }
  }
  else {
    av1_pick_cdef_from_qp
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
  }
  return;
}

Assistant:

void av1_cdef_search(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CDEF_CONTROL cdef_control = cpi->oxcf.tool_cfg.cdef_control;

  assert(cdef_control != CDEF_NONE);
  // For CDEF_ADAPTIVE, turning off CDEF around qindex 32 was best for still
  // pictures
  if ((cdef_control == CDEF_REFERENCE &&
       cpi->ppi->rtc_ref.non_reference_frame) ||
      (cdef_control == CDEF_ADAPTIVE && cpi->oxcf.mode == ALLINTRA &&
       (cpi->oxcf.rc_cfg.mode == AOM_Q || cpi->oxcf.rc_cfg.mode == AOM_CQ) &&
       cpi->oxcf.rc_cfg.cq_level <= 32)) {
    CdefInfo *const cdef_info = &cm->cdef_info;
    cdef_info->nb_cdef_strengths = 1;
    cdef_info->cdef_bits = 0;
    cdef_info->cdef_strengths[0] = 0;
    cdef_info->cdef_uv_strengths[0] = 0;
    return;
  }

  // Indicate if external RC is used for testing
  const int rtc_ext_rc = cpi->rc.rtc_external_ratectrl;
  if (rtc_ext_rc) {
    av1_pick_cdef_from_qp(cm, 0, 0);
    return;
  }
  CDEF_PICK_METHOD pick_method = cpi->sf.lpf_sf.cdef_pick_method;
  if (pick_method == CDEF_PICK_FROM_Q) {
    const int use_screen_content_model =
        cm->quant_params.base_qindex >
            AOMMAX(cpi->sf.rt_sf.screen_content_cdef_filter_qindex_thresh,
                   cpi->rc.best_quality + 5) &&
        cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
    av1_pick_cdef_from_qp(cm, cpi->sf.rt_sf.skip_cdef_sb,
                          use_screen_content_model);
    return;
  }
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int damping = 3 + (cm->quant_params.base_qindex >> 6);
  const int fast = (pick_method >= CDEF_FAST_SEARCH_LVL1 &&
                    pick_method <= CDEF_FAST_SEARCH_LVL5);
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &cpi->td.mb.e_mbd;

  if (!cpi->cdef_search_ctx)
    CHECK_MEM_ERROR(cm, cpi->cdef_search_ctx,
                    aom_malloc(sizeof(*cpi->cdef_search_ctx)));
  CdefSearchCtx *cdef_search_ctx = cpi->cdef_search_ctx;

  // Initialize parameters related to CDEF search context.
  cdef_params_init(&cm->cur_frame->buf, cpi->source, cm, xd, cdef_search_ctx,
                   pick_method);
  // Allocate CDEF search context buffers.
  cdef_alloc_data(cm, cdef_search_ctx);
  // Frame level mse calculation.
  if (cpi->mt_info.num_workers > 1) {
    av1_cdef_mse_calc_frame_mt(cpi);
  } else {
    cdef_mse_calc_frame(cdef_search_ctx, cm->error);
  }

  /* Search for different number of signaling bits. */
  int nb_strength_bits = 0;
  uint64_t best_rd = UINT64_MAX;
  CdefInfo *const cdef_info = &cm->cdef_info;
  int sb_count = cdef_search_ctx->sb_count;
  uint64_t(*mse[2])[TOTAL_STRENGTHS];
  mse[0] = cdef_search_ctx->mse[0];
  mse[1] = cdef_search_ctx->mse[1];
  /* Calculate the maximum number of bits required to signal CDEF strengths at
   * block level */
  const int total_strengths = nb_cdef_strengths[pick_method];
  const int joint_strengths =
      num_planes > 1 ? total_strengths * total_strengths : total_strengths;
  const int max_signaling_bits =
      joint_strengths == 1 ? 0 : get_msb(joint_strengths - 1) + 1;
  int rdmult = cpi->td.mb.rdmult;
  for (int i = 0; i <= 3; i++) {
    if (i > max_signaling_bits) break;
    int best_lev0[CDEF_MAX_STRENGTHS] = { 0 };
    int best_lev1[CDEF_MAX_STRENGTHS] = { 0 };
    const int nb_strengths = 1 << i;
    uint64_t tot_mse;
    if (num_planes > 1) {
      tot_mse = joint_strength_search_dual(best_lev0, best_lev1, nb_strengths,
                                           mse, sb_count, pick_method);
    } else {
      tot_mse = joint_strength_search(best_lev0, nb_strengths, mse[0], sb_count,
                                      pick_method);
    }

    const int total_bits = sb_count * i + nb_strengths * CDEF_STRENGTH_BITS *
                                              (num_planes > 1 ? 2 : 1);
    const int rate_cost = av1_cost_literal(total_bits);
    const uint64_t dist = tot_mse * 16;
    const uint64_t rd = RDCOST(rdmult, rate_cost, dist);
    if (rd < best_rd) {
      best_rd = rd;
      nb_strength_bits = i;
      memcpy(cdef_info->cdef_strengths, best_lev0,
             nb_strengths * sizeof(best_lev0[0]));
      if (num_planes > 1) {
        memcpy(cdef_info->cdef_uv_strengths, best_lev1,
               nb_strengths * sizeof(best_lev1[0]));
      }
    }
  }

  cdef_info->cdef_bits = nb_strength_bits;
  cdef_info->nb_cdef_strengths = 1 << nb_strength_bits;
  for (int i = 0; i < sb_count; i++) {
    uint64_t best_mse = UINT64_MAX;
    int best_gi = 0;
    for (int gi = 0; gi < cdef_info->nb_cdef_strengths; gi++) {
      uint64_t curr = mse[0][i][cdef_info->cdef_strengths[gi]];
      if (num_planes > 1) curr += mse[1][i][cdef_info->cdef_uv_strengths[gi]];
      if (curr < best_mse) {
        best_gi = gi;
        best_mse = curr;
      }
    }
    mi_params->mi_grid_base[cdef_search_ctx->sb_index[i]]->cdef_strength =
        best_gi;
  }
  if (fast) {
    for (int j = 0; j < cdef_info->nb_cdef_strengths; j++) {
      const int luma_strength = cdef_info->cdef_strengths[j];
      const int chroma_strength = cdef_info->cdef_uv_strengths[j];
      int pri_strength, sec_strength;

      STORE_CDEF_FILTER_STRENGTH(cdef_info->cdef_strengths[j], pick_method,
                                 luma_strength);
      STORE_CDEF_FILTER_STRENGTH(cdef_info->cdef_uv_strengths[j], pick_method,
                                 chroma_strength);
    }
  }

  // For CDEF_ADAPTIVE, set primary and secondary CDEF at reduced strength for
  // qindexes 33 through 220.
  // Note 1: for odd strengths, the 0.5 discarded by ">> 1" is a significant
  // part of the strength when the strength is small, and because there are
  // few strength levels, odd strengths are reduced significantly more than a
  // half. This is intended behavior for reduced strength.
  // For example: a pri strength of 3 becomes 1, and a sec strength of 1
  // becomes 0.
  // Note 2: a (signaled) sec strength value of 3 is special as it results in an
  // actual sec strength of 4. We tried adding +1 to the sec strength 3 so it
  // maps to a reduced sec strength of 2. However, on Daala's subset1, the
  // resulting SSIMULACRA 2 scores were either exactly the same (at cpu-used 6),
  // or within noise level (at cpu-used 3). Given that there were no discernible
  // improvements, this special mapping was left out for reduced strength.
  if (cdef_control == CDEF_ADAPTIVE && cpi->oxcf.mode == ALLINTRA &&
      (cpi->oxcf.rc_cfg.mode == AOM_Q || cpi->oxcf.rc_cfg.mode == AOM_CQ) &&
      cpi->oxcf.rc_cfg.cq_level <= 220) {
    for (int j = 0; j < cdef_info->nb_cdef_strengths; j++) {
      const int luma_strength = cdef_info->cdef_strengths[j];
      const int chroma_strength = cdef_info->cdef_uv_strengths[j];

      const int new_pri_luma_strength =
          (luma_strength / CDEF_SEC_STRENGTHS) >> 1;
      const int new_sec_luma_strength =
          (luma_strength % CDEF_SEC_STRENGTHS) >> 1;
      const int new_pri_chroma_strength =
          (chroma_strength / CDEF_SEC_STRENGTHS) >> 1;
      const int new_sec_chroma_strength =
          (chroma_strength % CDEF_SEC_STRENGTHS) >> 1;

      cdef_info->cdef_strengths[j] =
          new_pri_luma_strength * CDEF_SEC_STRENGTHS + new_sec_luma_strength;
      cdef_info->cdef_uv_strengths[j] =
          new_pri_chroma_strength * CDEF_SEC_STRENGTHS +
          new_sec_chroma_strength;
    }
  }

  cdef_info->cdef_damping = damping;
  // Deallocate CDEF search context buffers.
  av1_cdef_dealloc_data(cdef_search_ctx);
}